

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eviction.cpp
# Opt level: O3

void ProtectEvictionCandidatesByRatio
               (vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                *eviction_candidates)

{
  pointer pNVar1;
  pointer pNVar2;
  function<bool_(const_NodeEvictionCandidate_&)> __pred;
  void *pvVar3;
  _Manager_type p_Var4;
  __normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
  _Var5;
  _Manager_type p_Var6;
  long lVar7;
  size_t delta;
  ulong uVar8;
  long lVar9;
  difference_type __n;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  pointer pNVar13;
  ulong uVar14;
  _Invoker_type p_Var15;
  ulong uVar16;
  _Iter_comp_iter<CompareNodeNetworkTime> __comp;
  __normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
  __last;
  __normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
  __last_00;
  long in_FS_OFFSET;
  byte bVar17;
  bool bVar18;
  array<Net,_4UL> networks;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  undefined8 local_78;
  long alStack_70 [8];
  
  alStack_70[7] = *(long *)(in_FS_OFFSET + 0x28);
  pNVar1 = (eviction_candidates->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pNVar2 = (eviction_candidates->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  uVar14 = ((long)pNVar2 - (long)pNVar1 >> 3) * -0x71c71c71c71c71c7;
  alStack_70[0] = 0;
  alStack_70[2] = 0;
  alStack_70[4] = 0;
  alStack_70[6] = 0;
  local_78 = 0x500000000;
  alStack_70[1] = 0x400000000;
  alStack_70[3] = 0x700000001;
  alStack_70[5] = 0x300000000;
  lVar7 = 0;
  do {
    if (pNVar1 == pNVar2) {
      lVar10 = 0;
    }
    else {
      lVar10 = 0;
      pNVar13 = pNVar1;
      do {
        if (*(char *)((long)alStack_70 + lVar7 + -8) == '\0') {
          bVar17 = *(Network *)((long)alStack_70 + lVar7 + -4) == pNVar13->m_network;
        }
        else {
          bVar17 = pNVar13->m_is_local;
        }
        lVar10 = lVar10 + (ulong)(bVar17 & 1);
        pNVar13 = pNVar13 + 1;
      } while (pNVar13 != pNVar2);
    }
    *(long *)((long)alStack_70 + lVar7) = lVar10;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x40);
  p_Var15 = (_Invoker_type)(uVar14 >> 1);
  uVar11 = 4;
  do {
    uVar8 = uVar11 + 1 >> 1;
    uVar16 = uVar8 << 4;
    pvVar3 = operator_new(uVar16,(nothrow_t *)&std::nothrow);
    if (pvVar3 != (void *)0x0) {
      std::
      __stable_sort_adaptive<ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>&)::Net*,ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>&)::Net*,long,__gnu_cxx::__ops::_Iter_comp_iter<ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>&)::__3>>
                (&local_78,alStack_70 + 7,pvVar3,uVar8);
      goto LAB_0022700d;
    }
    bVar12 = 2 < uVar11;
    uVar11 = uVar8;
  } while (bVar12);
  std::
  __insertion_sort<ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>&)::Net*,__gnu_cxx::__ops::_Iter_comp_iter<ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>&)::__3>>
            (&local_78,alStack_70 + 7);
  uVar16 = 0;
LAB_0022700d:
  operator_delete(pvVar3,uVar16);
  if (uVar14 < 4) {
    p_Var6 = (_Manager_type)0x0;
  }
  else {
    p_Var4 = (_Manager_type)(uVar14 >> 2);
    p_Var6 = (_Manager_type)0x0;
    while( true ) {
      uVar11 = 0;
      lVar7 = 0;
      do {
        uVar11 = (uVar11 + 1) - (ulong)(*(long *)((long)alStack_70 + lVar7) == 0);
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x40);
      if (uVar11 == 0) break;
      bVar12 = false;
      uVar8 = (ulong)((long)p_Var4 - (long)p_Var6) / uVar11;
      if ((ulong)((long)p_Var4 - (long)p_Var6) < uVar11) {
        uVar8 = 1;
      }
      lVar7 = 0;
      do {
        while (*(long *)((long)alStack_70 + lVar7) == 0) {
LAB_002271da:
          lVar7 = lVar7 + 0x10;
          if (lVar7 == 0x40) {
            if (!bVar12) goto LAB_0022722f;
            goto LAB_00227225;
          }
        }
        _Var5._M_current =
             (eviction_candidates->
             super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
             _M_impl.super__Vector_impl_data._M_start;
        __last._M_current =
             (eviction_candidates->
             super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        uVar11 = ((long)__last._M_current - (long)_Var5._M_current >> 3) * -0x71c71c71c71c71c7;
        local_b8._M_unused._0_8_ = (undefined8)((long)alStack_70 + lVar7 + -8);
        local_b8._8_8_ = 0;
        local_a0 = std::
                   _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:152:53)>
                   ::_M_invoke;
        local_a8 = std::
                   _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:152:53)>
                   ::_M_manager;
        __last_00._M_current = __last._M_current;
        if (__last._M_current != _Var5._M_current) {
          __comp._M_comp =
               (CompareNodeNetworkTime)
               ((ulong)*(uint *)((long)alStack_70 + lVar7 + -4) << 0x20 |
               (ulong)(byte)*local_b8._M_unused._M_function_pointer);
          lVar10 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar10 == 0; lVar10 = lVar10 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<NodeEvictionCandidate*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<CompareNodeNetworkTime>>
                    (_Var5,__last,(ulong)(((uint)lVar10 ^ 0x3f) * 2) ^ 0x7e,__comp);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<NodeEvictionCandidate*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>,__gnu_cxx::__ops::_Iter_comp_iter<CompareNodeNetworkTime>>
                    (_Var5,__last,__comp);
          __last._M_current =
               (eviction_candidates->
               super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
               _M_impl.super__Vector_impl_data._M_start;
          __last_00._M_current =
               (eviction_candidates->
               super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
               _M_impl.super__Vector_impl_data._M_finish;
        }
        std::function<bool_(const_NodeEvictionCandidate_&)>::function
                  ((function<bool_(const_NodeEvictionCandidate_&)> *)&local_98,
                   (function<bool_(const_NodeEvictionCandidate_&)> *)&local_b8);
        uVar16 = ((long)__last_00._M_current - (long)__last._M_current >> 3) * -0x71c71c71c71c71c7;
        if (uVar8 <= uVar16) {
          uVar16 = uVar8;
        }
        __pred.super__Function_base._M_functor._8_8_ = uVar14;
        __pred.super__Function_base._M_functor._M_unused._M_object = p_Var4;
        __pred.super__Function_base._M_manager = p_Var6;
        __pred._M_invoker = p_Var15;
        _Var5 = std::
                remove_if<__gnu_cxx::__normal_iterator<NodeEvictionCandidate*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>,std::function<bool(NodeEvictionCandidate_const&)>>
                          (__last_00._M_current + -uVar16,__last_00,__pred);
        if (_Var5._M_current !=
            (eviction_candidates->
            super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          (eviction_candidates->
          super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)._M_impl
          .super__Vector_impl_data._M_finish = _Var5._M_current;
        }
        if (local_88 != (code *)0x0) {
          (*local_88)(&local_98,&local_98,__destroy_functor);
        }
        if (local_a8 != (code *)0x0) {
          (*local_a8)(&local_b8,&local_b8,__destroy_functor);
        }
        lVar10 = (long)(eviction_candidates->
                       super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(eviction_candidates->
                       super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 3;
        lVar9 = uVar11 + lVar10 * 0x71c71c71c71c71c7;
        if (uVar11 < (ulong)(lVar10 * -0x71c71c71c71c71c7) || lVar9 == 0) goto LAB_002271da;
        p_Var6 = p_Var6 + lVar9;
        if (p_Var4 <= p_Var6) break;
        *(long *)((long)alStack_70 + lVar7) = *(long *)((long)alStack_70 + lVar7) - lVar9;
        bVar12 = true;
        bVar18 = lVar7 != 0x30;
        lVar7 = lVar7 + 0x10;
      } while (bVar18);
LAB_00227225:
      if (p_Var4 <= p_Var6) break;
    }
  }
LAB_0022722f:
  if (p_Var6 != (_Manager_type)
                (((long)(eviction_candidates->
                        super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(eviction_candidates->
                        super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x71c71c71c71c71c7 +
                uVar14)) {
    __assert_fail("num_protected == initial_size - eviction_candidates.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp"
                  ,0xad,
                  "void ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate> &)");
  }
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_manager;
  EraseLastKElements<NodeEvictionCandidate,bool(*)(NodeEvictionCandidate_const&,NodeEvictionCandidate_const&)>
            (eviction_candidates,ReverseCompareNodeTimeConnected,(long)p_Var15 - (long)p_Var6,
             (function<bool_(const_NodeEvictionCandidate_&)> *)&local_d8);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != alStack_70[7]) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ProtectEvictionCandidatesByRatio(std::vector<NodeEvictionCandidate>& eviction_candidates)
{
    // Protect the half of the remaining nodes which have been connected the longest.
    // This replicates the non-eviction implicit behavior, and precludes attacks that start later.
    // To favorise the diversity of our peer connections, reserve up to half of these protected
    // spots for Tor/onion, localhost, I2P, and CJDNS peers, even if they're not longest uptime
    // overall. This helps protect these higher-latency peers that tend to be otherwise
    // disadvantaged under our eviction criteria.
    const size_t initial_size = eviction_candidates.size();
    const size_t total_protect_size{initial_size / 2};

    // Disadvantaged networks to protect. In the case of equal counts, earlier array members
    // have the first opportunity to recover unused slots from the previous iteration.
    struct Net { bool is_local; Network id; size_t count; };
    std::array<Net, 4> networks{
        {{false, NET_CJDNS, 0}, {false, NET_I2P, 0}, {/*localhost=*/true, NET_MAX, 0}, {false, NET_ONION, 0}}};

    // Count and store the number of eviction candidates per network.
    for (Net& n : networks) {
        n.count = std::count_if(eviction_candidates.cbegin(), eviction_candidates.cend(),
                                [&n](const NodeEvictionCandidate& c) {
                                    return n.is_local ? c.m_is_local : c.m_network == n.id;
                                });
    }
    // Sort `networks` by ascending candidate count, to give networks having fewer candidates
    // the first opportunity to recover unused protected slots from the previous iteration.
    std::stable_sort(networks.begin(), networks.end(), [](Net a, Net b) { return a.count < b.count; });

    // Protect up to 25% of the eviction candidates by disadvantaged network.
    const size_t max_protect_by_network{total_protect_size / 2};
    size_t num_protected{0};

    while (num_protected < max_protect_by_network) {
        // Count the number of disadvantaged networks from which we have peers to protect.
        auto num_networks = std::count_if(networks.begin(), networks.end(), [](const Net& n) { return n.count; });
        if (num_networks == 0) {
            break;
        }
        const size_t disadvantaged_to_protect{max_protect_by_network - num_protected};
        const size_t protect_per_network{std::max(disadvantaged_to_protect / num_networks, static_cast<size_t>(1))};
        // Early exit flag if there are no remaining candidates by disadvantaged network.
        bool protected_at_least_one{false};

        for (Net& n : networks) {
            if (n.count == 0) continue;
            const size_t before = eviction_candidates.size();
            EraseLastKElements(eviction_candidates, CompareNodeNetworkTime(n.is_local, n.id),
                               protect_per_network, [&n](const NodeEvictionCandidate& c) {
                                   return n.is_local ? c.m_is_local : c.m_network == n.id;
                               });
            const size_t after = eviction_candidates.size();
            if (before > after) {
                protected_at_least_one = true;
                const size_t delta{before - after};
                num_protected += delta;
                if (num_protected >= max_protect_by_network) {
                    break;
                }
                n.count -= delta;
            }
        }
        if (!protected_at_least_one) {
            break;
        }
    }

    // Calculate how many we removed, and update our total number of peers that
    // we want to protect based on uptime accordingly.
    assert(num_protected == initial_size - eviction_candidates.size());
    const size_t remaining_to_protect{total_protect_size - num_protected};
    EraseLastKElements(eviction_candidates, ReverseCompareNodeTimeConnected, remaining_to_protect);
}